

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall cfd::TransactionContext::Verify(TransactionContext *this)

{
  bool bVar1;
  AbstractTxIn *this_00;
  long in_RDI;
  OutPoint outpoint;
  TxIn *vin;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *__range1;
  OutPoint *in_stack_00000bc8;
  TransactionContext *in_stack_00000bd0;
  OutPoint *in_stack_ffffffffffffffa8;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *in_stack_ffffffffffffffb0;
  TransactionContext *in_stack_ffffffffffffffb8;
  __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_20;
  __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_18;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *local_10;
  
  local_10 = (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)(in_RDI + 0x10);
  local_18._M_current =
       (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::begin(local_10);
  local_20._M_current =
       (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::end(local_10);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
               ::operator*(&local_18)->super_AbstractTxIn;
    core::AbstractTxIn::GetOutPoint((OutPoint *)&stack0xffffffffffffffb0,this_00);
    bVar1 = IsFindOutPoint(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffa8);
    if (!bVar1) {
      Verify(in_stack_00000bd0,in_stack_00000bc8);
    }
    core::OutPoint::~OutPoint((OutPoint *)0x53b613);
    __gnu_cxx::
    __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void TransactionContext::Verify() {
  for (const auto& vin : vin_) {
    OutPoint outpoint = vin.GetOutPoint();
    if (!IsFindOutPoint(verify_ignore_map_, outpoint)) {
      Verify(outpoint);
    }
  }
}